

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.hpp
# Opt level: O0

void __thiscall tcmalloc::PageHeap::PageHeap(PageHeap *this)

{
  Span *local_48;
  Span *local_28;
  uint local_20;
  int i;
  PageHeap *this_local;
  
  std::mutex::mutex(&this->lock);
  local_28 = this->small_normal_;
  do {
    Span::Span(local_28);
    local_28 = local_28 + 1;
  } while (local_28 != this->small_returned_);
  local_48 = this->small_returned_;
  do {
    Span::Span(local_48);
    local_48 = local_48 + 1;
  } while (local_48 != (Span *)this->small_normal_size_);
  std::
  set<tcmalloc::Span_*,_tcmalloc::SpanLessCompare,_tcmalloc::STLFixedAllocator<tcmalloc::Span_*,_0>_>
  ::set(&this->large_normal_);
  std::
  set<tcmalloc::Span_*,_tcmalloc::SpanLessCompare,_tcmalloc::STLFixedAllocator<tcmalloc::Span_*,_0>_>
  ::set(&this->large_returned_);
  PageMap::PageMap(&this->page_map_);
  (this->stat).system_bytes = 0;
  (this->stat).normal_bytes = 0;
  (this->stat).returned_bytes = 0;
  (this->stat).in_used_bytes = 0;
  (this->stat).large_normal_bytes = 0;
  (this->stat).large_returned_bytes = 0;
  this->release_index_ = 0;
  this->release_rate_ = 100;
  for (local_20 = 0; local_20 < 0x80; local_20 = local_20 + 1) {
    ListInit(this->small_normal_ + (int)local_20);
    ListInit(this->small_returned_ + (int)local_20);
  }
  return;
}

Assistant:

PageHeap() {
        stat.system_bytes = 0;
        stat.normal_bytes = 0;
        stat.returned_bytes = 0;
        stat.in_used_bytes = 0;

        stat.large_normal_bytes = 0;
        stat.large_returned_bytes = 0;

        release_index_ = 0;
        release_rate_ = 100;

        for (int i = 0; i <= spanSmallPages; ++i) {
            ListInit(&small_normal_[i]);
            ListInit(&small_returned_[i]);
        }
    }